

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ihevcd_it_rec_dc_sse42_intr.c
# Opt level: O0

void ihevcd_itrans_recon_dc_luma_sse42
               (UWORD8 *pu1_pred,UWORD8 *pu1_dst,WORD32 pred_strd,WORD32 dst_strd,
               WORD32 log2_trans_size,WORD16 i2_coeff_value)

{
  undefined8 uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined4 uVar5;
  undefined6 uVar6;
  undefined4 uVar7;
  undefined6 uVar8;
  undefined4 uVar9;
  undefined6 uVar10;
  int iVar11;
  int iVar12;
  undefined4 *puVar13;
  int in_ECX;
  int in_EDX;
  undefined8 *in_RSI;
  undefined8 *in_RDI;
  byte in_R8B;
  short in_R9W;
  short sVar14;
  short sVar15;
  short sVar16;
  short sVar17;
  short sVar18;
  short sVar19;
  short sVar20;
  short sVar21;
  short sVar22;
  short sVar23;
  short sVar24;
  short sVar25;
  short sVar26;
  short sVar27;
  short sVar28;
  short sVar29;
  short sVar30;
  short sVar31;
  short sVar32;
  short sVar33;
  short sVar34;
  short sVar35;
  short sVar36;
  short sVar37;
  short sVar38;
  short sVar39;
  __m128i m_temp_reg_14;
  __m128i m_temp_reg_13;
  __m128i m_temp_reg_12;
  __m128i m_temp_reg_11;
  __m128i m_temp_reg_10;
  __m128i m_temp_reg_9;
  __m128i m_temp_reg_8;
  __m128i m_temp_reg_7;
  __m128i m_temp_reg_6;
  __m128i m_temp_reg_5;
  __m128i m_temp_reg_4;
  __m128i m_temp_reg_3;
  __m128i m_temp_reg_2;
  __m128i m_temp_reg_1;
  __m128i m_temp_reg_0;
  short local_5e8;
  short local_5e4;
  int local_5e0;
  int local_5dc;
  int local_5d8;
  int local_5d4;
  char cStack_516;
  undefined1 uStack_515;
  char cStack_514;
  undefined1 uStack_513;
  char cStack_512;
  undefined1 uStack_511;
  char cStack_50e;
  undefined1 uStack_50d;
  char cStack_50c;
  undefined1 uStack_50b;
  char cStack_50a;
  undefined1 uStack_509;
  char cStack_506;
  undefined1 uStack_505;
  char cStack_504;
  undefined1 uStack_503;
  char cStack_502;
  undefined1 uStack_501;
  char cStack_4f6;
  undefined1 uStack_4f5;
  char cStack_4f4;
  undefined1 uStack_4f3;
  char cStack_4f2;
  undefined1 uStack_4f1;
  char cStack_4ee;
  undefined1 uStack_4ed;
  char cStack_4ec;
  undefined1 uStack_4eb;
  char cStack_4ea;
  undefined1 uStack_4e9;
  byte bStack_4d4;
  byte bStack_4d3;
  byte bStack_4d2;
  byte bStack_4d1;
  undefined8 *local_470;
  undefined8 *local_468;
  byte local_2f8;
  byte bStack_2f7;
  byte bStack_2f6;
  byte bStack_2f5;
  byte bStack_2f4;
  byte bStack_2f3;
  byte bStack_2f2;
  byte bStack_2f1;
  byte local_2d8;
  byte bStack_2d7;
  byte bStack_2d6;
  byte bStack_2d5;
  byte bStack_2d4;
  byte bStack_2d3;
  byte bStack_2d2;
  byte bStack_2d1;
  byte local_2b8;
  byte bStack_2b7;
  byte bStack_2b6;
  byte bStack_2b5;
  byte bStack_2b4;
  byte bStack_2b3;
  byte bStack_2b2;
  byte bStack_2b1;
  byte local_298;
  byte bStack_297;
  byte bStack_296;
  byte bStack_295;
  byte bStack_294;
  byte bStack_293;
  byte bStack_292;
  byte bStack_291;
  byte local_278;
  byte bStack_277;
  byte bStack_276;
  byte bStack_275;
  byte local_258;
  byte bStack_257;
  byte bStack_256;
  byte bStack_255;
  ushort uStack_236;
  ushort uStack_234;
  ushort uStack_232;
  ushort uStack_22e;
  ushort uStack_22c;
  ushort uStack_22a;
  ushort uStack_216;
  ushort uStack_214;
  ushort uStack_212;
  ushort uStack_20e;
  ushort uStack_20c;
  ushort uStack_20a;
  ushort uStack_1f6;
  ushort uStack_1f4;
  ushort uStack_1f2;
  ushort uStack_1ee;
  ushort uStack_1ec;
  ushort uStack_1ea;
  ushort uStack_1d6;
  ushort uStack_1d4;
  ushort uStack_1d2;
  ushort uStack_1ce;
  ushort uStack_1cc;
  ushort uStack_1ca;
  ushort uStack_1b6;
  ushort uStack_1b4;
  ushort uStack_1b2;
  ushort uStack_196;
  ushort uStack_194;
  ushort uStack_192;
  ushort uStack_18e;
  ushort uStack_18c;
  ushort uStack_18a;
  short sStack_156;
  short sStack_154;
  short sStack_152;
  short sStack_14e;
  short sStack_14c;
  short sStack_14a;
  short sStack_146;
  short sStack_144;
  short sStack_142;
  short sStack_136;
  short sStack_134;
  short sStack_132;
  short sStack_12e;
  short sStack_12c;
  short sStack_12a;
  WORD32 j;
  WORD32 i;
  WORD32 *pi4_dst_1;
  WORD32 trans_size;
  WORD32 quant_out;
  WORD32 dc_value;
  WORD32 shift;
  WORD32 add;
  __m128i *pi4_dst;
  __m128i zero_8x16b;
  __m128i m_temp_reg_20;
  __m128i m_temp_reg_15;
  
  iVar11 = 1 << (in_R8B & 0x1f);
  iVar12 = (int)in_R9W;
  if (iVar12 * 0x40 + 0x40 >> 7 < 0x8000) {
    if (iVar12 * 0x40 + 0x40 >> 7 < -0x8000) {
      local_5e0 = -0x8000;
    }
    else {
      local_5e0 = iVar12 * 0x40 + 0x40 >> 7;
    }
    local_5dc = local_5e0;
  }
  else {
    local_5dc = 0x7fff;
  }
  if (local_5dc * 0x40 + 0x800 >> 0xc < 0x8000) {
    if (local_5dc * 0x40 + 0x800 >> 0xc < -0x8000) {
      local_5e8 = -0x8000;
    }
    else {
      local_5e8 = (short)(local_5dc * 0x40 + 0x800 >> 0xc);
    }
    local_5e4 = local_5e8;
  }
  else {
    local_5e4 = 0x7fff;
  }
  if (iVar11 == 4) {
    uVar1 = *in_RDI;
    uVar2 = *(undefined8 *)((long)in_RDI + (long)in_EDX);
    uVar3 = *(undefined8 *)((long)in_RDI + (long)(in_EDX * 2));
    bStack_4d4 = (byte)uVar2;
    bStack_4d3 = (byte)((ulong)uVar2 >> 8);
    bStack_4d2 = (byte)((ulong)uVar2 >> 0x10);
    bStack_4d1 = (byte)((ulong)uVar2 >> 0x18);
    local_258 = (byte)uVar1;
    bStack_257 = (byte)((ulong)uVar1 >> 8);
    bStack_256 = (byte)((ulong)uVar1 >> 0x10);
    bStack_255 = (byte)((ulong)uVar1 >> 0x18);
    local_278 = (byte)uVar3;
    bStack_277 = (byte)((ulong)uVar3 >> 8);
    bStack_276 = (byte)((ulong)uVar3 >> 0x10);
    bStack_275 = (byte)((ulong)uVar3 >> 0x18);
    uStack_196 = (ushort)bStack_257;
    uStack_194 = (ushort)bStack_256;
    uStack_192 = (ushort)bStack_255;
    uStack_18e = (ushort)bStack_4d3;
    uStack_18c = (ushort)bStack_4d2;
    uStack_18a = (ushort)bStack_4d1;
    sVar14 = (ushort)local_258 + local_5e4;
    sVar26 = (ushort)bStack_4d4 + local_5e4;
    cStack_4f6 = (char)(uStack_196 + local_5e4);
    uStack_4f5 = (undefined1)((ushort)(uStack_196 + local_5e4) >> 8);
    cStack_4f4 = (char)(uStack_194 + local_5e4);
    uStack_4f3 = (undefined1)((ushort)(uStack_194 + local_5e4) >> 8);
    cStack_4f2 = (char)(uStack_192 + local_5e4);
    uStack_4f1 = (undefined1)((ushort)(uStack_192 + local_5e4) >> 8);
    cStack_4ee = (char)(uStack_18e + local_5e4);
    uStack_4ed = (undefined1)((ushort)(uStack_18e + local_5e4) >> 8);
    cStack_4ec = (char)(uStack_18c + local_5e4);
    uStack_4eb = (undefined1)((ushort)(uStack_18c + local_5e4) >> 8);
    cStack_4ea = (char)(uStack_18a + local_5e4);
    uStack_4e9 = (undefined1)((ushort)(uStack_18a + local_5e4) >> 8);
    uStack_1b6 = (ushort)bStack_277;
    uStack_1b4 = (ushort)bStack_276;
    uStack_1b2 = (ushort)bStack_275;
    sVar15 = (ushort)local_278 + local_5e4;
    cStack_506 = (char)(uStack_1b6 + local_5e4);
    uStack_505 = (undefined1)((ushort)(uStack_1b6 + local_5e4) >> 8);
    cStack_504 = (char)(uStack_1b4 + local_5e4);
    uStack_503 = (undefined1)((ushort)(uStack_1b4 + local_5e4) >> 8);
    cStack_502 = (char)(uStack_1b2 + local_5e4);
    uStack_501 = (undefined1)((ushort)(uStack_1b2 + local_5e4) >> 8);
    uVar7 = CONCAT13(uStack_4f5,CONCAT12(cStack_4f6,sVar14));
    uVar8 = CONCAT15(uStack_4f3,CONCAT14(cStack_4f4,uVar7));
    uVar9 = CONCAT13(uStack_4ed,CONCAT12(cStack_4ee,sVar26));
    uVar10 = CONCAT15(uStack_4eb,CONCAT14(cStack_4ec,uVar9));
    uVar5 = CONCAT13(uStack_505,CONCAT12(cStack_506,sVar15));
    uVar6 = CONCAT15(uStack_503,CONCAT14(cStack_504,uVar5));
    sStack_136 = (short)((uint)uVar7 >> 0x10);
    sStack_134 = (short)((uint6)uVar8 >> 0x20);
    sStack_132 = (short)(CONCAT17(uStack_4f1,CONCAT16(cStack_4f2,uVar8)) >> 0x30);
    sStack_12e = (short)((uint)uVar9 >> 0x10);
    sStack_12c = (short)((uint6)uVar10 >> 0x20);
    sStack_12a = (short)(CONCAT17(uStack_4e9,CONCAT16(cStack_4ea,uVar10)) >> 0x30);
    sStack_146 = (short)((uint)uVar5 >> 0x10);
    sStack_144 = (short)((uint6)uVar6 >> 0x20);
    sStack_142 = (short)(CONCAT17(uStack_501,CONCAT16(cStack_502,uVar6)) >> 0x30);
    *(uint *)in_RSI =
         CONCAT13((0 < sStack_132) * (sStack_132 < 0x100) * cStack_4f2 - (0xff < sStack_132),
                  CONCAT12((0 < sStack_134) * (sStack_134 < 0x100) * cStack_4f4 -
                           (0xff < sStack_134),
                           CONCAT11((0 < sStack_136) * (sStack_136 < 0x100) * cStack_4f6 -
                                    (0xff < sStack_136),
                                    (0 < sVar14) * (sVar14 < 0x100) * (char)sVar14 - (0xff < sVar14)
                                   )));
    *(undefined4 *)((long)in_RSI + (long)in_ECX) =
         CONCAT13((0 < sStack_12a) * (sStack_12a < 0x100) * cStack_4ea - (0xff < sStack_12a),
                  CONCAT12((0 < sStack_12c) * (sStack_12c < 0x100) * cStack_4ec -
                           (0xff < sStack_12c),
                           CONCAT11((0 < sStack_12e) * (sStack_12e < 0x100) * cStack_4ee -
                                    (0xff < sStack_12e),
                                    (0 < sVar26) * (sVar26 < 0x100) * (char)sVar26 - (0xff < sVar26)
                                   )));
    puVar13 = (undefined4 *)((long)in_RSI + (long)in_ECX + (long)in_ECX);
    *puVar13 = CONCAT13((0 < sStack_142) * (sStack_142 < 0x100) * cStack_502 - (0xff < sStack_142),
                        CONCAT12((0 < sStack_144) * (sStack_144 < 0x100) * cStack_504 -
                                 (0xff < sStack_144),
                                 CONCAT11((0 < sStack_146) * (sStack_146 < 0x100) * cStack_506 -
                                          (0xff < sStack_146),
                                          (0 < sVar15) * (sVar15 < 0x100) * (char)sVar15 -
                                          (0xff < sVar15))));
    *(undefined4 *)((long)puVar13 + (long)in_ECX) = 0;
  }
  else {
    local_470 = in_RSI;
    local_468 = in_RDI;
    for (local_5d4 = 1; local_5d4 <= iVar11; local_5d4 = local_5d4 + 4) {
      for (local_5d8 = 1; local_5d8 <= iVar11; local_5d8 = local_5d8 + 8) {
        uVar1 = *local_468;
        uVar2 = *(undefined8 *)((long)local_468 + (long)in_EDX);
        uVar3 = *(undefined8 *)((long)local_468 + (long)(in_EDX * 2));
        uVar4 = *(undefined8 *)((long)local_468 + (long)(in_EDX * 3));
        local_298 = (byte)uVar1;
        bStack_297 = (byte)((ulong)uVar1 >> 8);
        bStack_296 = (byte)((ulong)uVar1 >> 0x10);
        bStack_295 = (byte)((ulong)uVar1 >> 0x18);
        bStack_294 = (byte)((ulong)uVar1 >> 0x20);
        bStack_293 = (byte)((ulong)uVar1 >> 0x28);
        bStack_292 = (byte)((ulong)uVar1 >> 0x30);
        bStack_291 = (byte)((ulong)uVar1 >> 0x38);
        local_2b8 = (byte)uVar2;
        bStack_2b7 = (byte)((ulong)uVar2 >> 8);
        bStack_2b6 = (byte)((ulong)uVar2 >> 0x10);
        bStack_2b5 = (byte)((ulong)uVar2 >> 0x18);
        bStack_2b4 = (byte)((ulong)uVar2 >> 0x20);
        bStack_2b3 = (byte)((ulong)uVar2 >> 0x28);
        bStack_2b2 = (byte)((ulong)uVar2 >> 0x30);
        bStack_2b1 = (byte)((ulong)uVar2 >> 0x38);
        local_2d8 = (byte)uVar3;
        bStack_2d7 = (byte)((ulong)uVar3 >> 8);
        bStack_2d6 = (byte)((ulong)uVar3 >> 0x10);
        bStack_2d5 = (byte)((ulong)uVar3 >> 0x18);
        bStack_2d4 = (byte)((ulong)uVar3 >> 0x20);
        bStack_2d3 = (byte)((ulong)uVar3 >> 0x28);
        bStack_2d2 = (byte)((ulong)uVar3 >> 0x30);
        bStack_2d1 = (byte)((ulong)uVar3 >> 0x38);
        local_2f8 = (byte)uVar4;
        bStack_2f7 = (byte)((ulong)uVar4 >> 8);
        bStack_2f6 = (byte)((ulong)uVar4 >> 0x10);
        bStack_2f5 = (byte)((ulong)uVar4 >> 0x18);
        bStack_2f4 = (byte)((ulong)uVar4 >> 0x20);
        bStack_2f3 = (byte)((ulong)uVar4 >> 0x28);
        bStack_2f2 = (byte)((ulong)uVar4 >> 0x30);
        bStack_2f1 = (byte)((ulong)uVar4 >> 0x38);
        uStack_1d6 = (ushort)bStack_297;
        uStack_1d4 = (ushort)bStack_296;
        uStack_1d2 = (ushort)bStack_295;
        uStack_1ce = (ushort)bStack_293;
        uStack_1cc = (ushort)bStack_292;
        uStack_1ca = (ushort)bStack_291;
        sVar14 = (ushort)local_298 + local_5e4;
        sVar27 = (ushort)bStack_294 + local_5e4;
        cStack_516 = (char)(uStack_1d6 + local_5e4);
        uStack_515 = (undefined1)((ushort)(uStack_1d6 + local_5e4) >> 8);
        cStack_514 = (char)(uStack_1d4 + local_5e4);
        uStack_513 = (undefined1)((ushort)(uStack_1d4 + local_5e4) >> 8);
        cStack_512 = (char)(uStack_1d2 + local_5e4);
        uStack_511 = (undefined1)((ushort)(uStack_1d2 + local_5e4) >> 8);
        cStack_50e = (char)(uStack_1ce + local_5e4);
        uStack_50d = (undefined1)((ushort)(uStack_1ce + local_5e4) >> 8);
        cStack_50c = (char)(uStack_1cc + local_5e4);
        uStack_50b = (undefined1)((ushort)(uStack_1cc + local_5e4) >> 8);
        cStack_50a = (char)(uStack_1ca + local_5e4);
        uStack_509 = (undefined1)((ushort)(uStack_1ca + local_5e4) >> 8);
        uStack_1f6 = (ushort)bStack_2b7;
        uStack_1f4 = (ushort)bStack_2b6;
        uStack_1f2 = (ushort)bStack_2b5;
        uStack_1ee = (ushort)bStack_2b3;
        uStack_1ec = (ushort)bStack_2b2;
        uStack_1ea = (ushort)bStack_2b1;
        sVar15 = (ushort)local_2b8 + local_5e4;
        sVar17 = uStack_1f6 + local_5e4;
        sVar20 = uStack_1f4 + local_5e4;
        sVar23 = uStack_1f2 + local_5e4;
        sVar28 = (ushort)bStack_2b4 + local_5e4;
        sVar31 = uStack_1ee + local_5e4;
        sVar34 = uStack_1ec + local_5e4;
        sVar37 = uStack_1ea + local_5e4;
        uStack_216 = (ushort)bStack_2d7;
        uStack_214 = (ushort)bStack_2d6;
        uStack_212 = (ushort)bStack_2d5;
        uStack_20e = (ushort)bStack_2d3;
        uStack_20c = (ushort)bStack_2d2;
        uStack_20a = (ushort)bStack_2d1;
        sVar26 = (ushort)local_2d8 + local_5e4;
        sVar18 = uStack_216 + local_5e4;
        sVar21 = uStack_214 + local_5e4;
        sVar24 = uStack_212 + local_5e4;
        sVar29 = (ushort)bStack_2d4 + local_5e4;
        sVar32 = uStack_20e + local_5e4;
        sVar35 = uStack_20c + local_5e4;
        sVar38 = uStack_20a + local_5e4;
        uStack_236 = (ushort)bStack_2f7;
        uStack_234 = (ushort)bStack_2f6;
        uStack_232 = (ushort)bStack_2f5;
        uStack_22e = (ushort)bStack_2f3;
        uStack_22c = (ushort)bStack_2f2;
        uStack_22a = (ushort)bStack_2f1;
        sVar16 = (ushort)local_2f8 + local_5e4;
        sVar19 = uStack_236 + local_5e4;
        sVar22 = uStack_234 + local_5e4;
        sVar25 = uStack_232 + local_5e4;
        sVar30 = (ushort)bStack_2f4 + local_5e4;
        sVar33 = uStack_22e + local_5e4;
        sVar36 = uStack_22c + local_5e4;
        sVar39 = uStack_22a + local_5e4;
        uVar5 = CONCAT13(uStack_515,CONCAT12(cStack_516,sVar14));
        uVar6 = CONCAT15(uStack_513,CONCAT14(cStack_514,uVar5));
        uVar7 = CONCAT13(uStack_50d,CONCAT12(cStack_50e,sVar27));
        uVar8 = CONCAT15(uStack_50b,CONCAT14(cStack_50c,uVar7));
        sStack_156 = (short)((uint)uVar5 >> 0x10);
        sStack_154 = (short)((uint6)uVar6 >> 0x20);
        sStack_152 = (short)(CONCAT17(uStack_511,CONCAT16(cStack_512,uVar6)) >> 0x30);
        sStack_14e = (short)((uint)uVar7 >> 0x10);
        sStack_14c = (short)((uint6)uVar8 >> 0x20);
        sStack_14a = (short)(CONCAT17(uStack_509,CONCAT16(cStack_50a,uVar8)) >> 0x30);
        *local_470 = CONCAT17((0 < sStack_14a) * (sStack_14a < 0x100) * cStack_50a -
                              (0xff < sStack_14a),
                              CONCAT16((0 < sStack_14c) * (sStack_14c < 0x100) * cStack_50c -
                                       (0xff < sStack_14c),
                                       CONCAT15((0 < sStack_14e) * (sStack_14e < 0x100) * cStack_50e
                                                - (0xff < sStack_14e),
                                                CONCAT14((0 < sVar27) * (sVar27 < 0x100) *
                                                         (char)sVar27 - (0xff < sVar27),
                                                         CONCAT13((0 < sStack_152) *
                                                                  (sStack_152 < 0x100) * cStack_512
                                                                  - (0xff < sStack_152),
                                                                  CONCAT12((0 < sStack_154) *
                                                                           (sStack_154 < 0x100) *
                                                                           cStack_514 -
                                                                           (0xff < sStack_154),
                                                                           CONCAT11((0 < sStack_156)
                                                                                    * (sStack_156 <
                                                                                      0x100) *
                                                                                    cStack_516 -
                                                                                    (0xff < 
                                                  sStack_156),
                                                  (0 < sVar14) * (sVar14 < 0x100) * (char)sVar14 -
                                                  (0xff < sVar14))))))));
        *(ulong *)((long)local_470 + (long)in_ECX) =
             CONCAT17((0 < sVar37) * (sVar37 < 0x100) * (char)sVar37 - (0xff < sVar37),
                      CONCAT16((0 < sVar34) * (sVar34 < 0x100) * (char)sVar34 - (0xff < sVar34),
                               CONCAT15((0 < sVar31) * (sVar31 < 0x100) * (char)sVar31 -
                                        (0xff < sVar31),
                                        CONCAT14((0 < sVar28) * (sVar28 < 0x100) * (char)sVar28 -
                                                 (0xff < sVar28),
                                                 CONCAT13((0 < sVar23) * (sVar23 < 0x100) *
                                                          (char)sVar23 - (0xff < sVar23),
                                                          CONCAT12((0 < sVar20) * (sVar20 < 0x100) *
                                                                   (char)sVar20 - (0xff < sVar20),
                                                                   CONCAT11((0 < sVar17) *
                                                                            (sVar17 < 0x100) *
                                                                            (char)sVar17 -
                                                                            (0xff < sVar17),
                                                                            (0 < sVar15) *
                                                                            (sVar15 < 0x100) *
                                                                            (char)sVar15 -
                                                                            (0xff < sVar15))))))));
        *(ulong *)((long)local_470 + (long)(in_ECX * 2)) =
             CONCAT17((0 < sVar38) * (sVar38 < 0x100) * (char)sVar38 - (0xff < sVar38),
                      CONCAT16((0 < sVar35) * (sVar35 < 0x100) * (char)sVar35 - (0xff < sVar35),
                               CONCAT15((0 < sVar32) * (sVar32 < 0x100) * (char)sVar32 -
                                        (0xff < sVar32),
                                        CONCAT14((0 < sVar29) * (sVar29 < 0x100) * (char)sVar29 -
                                                 (0xff < sVar29),
                                                 CONCAT13((0 < sVar24) * (sVar24 < 0x100) *
                                                          (char)sVar24 - (0xff < sVar24),
                                                          CONCAT12((0 < sVar21) * (sVar21 < 0x100) *
                                                                   (char)sVar21 - (0xff < sVar21),
                                                                   CONCAT11((0 < sVar18) *
                                                                            (sVar18 < 0x100) *
                                                                            (char)sVar18 -
                                                                            (0xff < sVar18),
                                                                            (0 < sVar26) *
                                                                            (sVar26 < 0x100) *
                                                                            (char)sVar26 -
                                                                            (0xff < sVar26))))))));
        *(ulong *)((long)local_470 + (long)(in_ECX * 3)) =
             CONCAT17((0 < sVar39) * (sVar39 < 0x100) * (char)sVar39 - (0xff < sVar39),
                      CONCAT16((0 < sVar36) * (sVar36 < 0x100) * (char)sVar36 - (0xff < sVar36),
                               CONCAT15((0 < sVar33) * (sVar33 < 0x100) * (char)sVar33 -
                                        (0xff < sVar33),
                                        CONCAT14((0 < sVar30) * (sVar30 < 0x100) * (char)sVar30 -
                                                 (0xff < sVar30),
                                                 CONCAT13((0 < sVar25) * (sVar25 < 0x100) *
                                                          (char)sVar25 - (0xff < sVar25),
                                                          CONCAT12((0 < sVar22) * (sVar22 < 0x100) *
                                                                   (char)sVar22 - (0xff < sVar22),
                                                                   CONCAT11((0 < sVar19) *
                                                                            (sVar19 < 0x100) *
                                                                            (char)sVar19 -
                                                                            (0xff < sVar19),
                                                                            (0 < sVar16) *
                                                                            (sVar16 < 0x100) *
                                                                            (char)sVar16 -
                                                                            (0xff < sVar16))))))));
        local_468 = local_468 + 1;
        local_470 = local_470 + 1;
      }
      local_468 = (undefined8 *)((long)local_468 + (long)(in_EDX * 4 - iVar11));
      local_470 = (undefined8 *)((long)local_470 + (long)(in_ECX * 4 - iVar11));
    }
  }
  return;
}

Assistant:

void ihevcd_itrans_recon_dc_luma_sse42(UWORD8 *pu1_pred, UWORD8 *pu1_dst, WORD32 pred_strd, WORD32 dst_strd,
                                       WORD32 log2_trans_size, WORD16 i2_coeff_value)
{
    __m128i m_temp_reg_0;
    __m128i m_temp_reg_1;
    __m128i m_temp_reg_2;
    __m128i m_temp_reg_3;
    __m128i m_temp_reg_4;
    __m128i m_temp_reg_5;
    __m128i m_temp_reg_6;
    __m128i m_temp_reg_7;
    __m128i m_temp_reg_8;
    __m128i m_temp_reg_9;
    __m128i m_temp_reg_10;
    __m128i m_temp_reg_11;
    __m128i m_temp_reg_12;
    __m128i m_temp_reg_13;
    __m128i m_temp_reg_14;
    __m128i m_temp_reg_15;
    __m128i m_temp_reg_20, zero_8x16b;
    __m128i *pi4_dst = (__m128i *)pu1_dst;


    //WORD32 row,col;
    WORD32 add, shift;
    WORD32 dc_value, quant_out;
    WORD32 trans_size;




    trans_size = (1 << log2_trans_size);

    quant_out = i2_coeff_value;

    shift = IT_SHIFT_STAGE_1;
    add = 1 << (shift - 1);
    dc_value = CLIP_S16((quant_out * 64 + add) >> shift);
    shift = IT_SHIFT_STAGE_2;
    add = 1 << (shift - 1);
    dc_value = CLIP_S16((dc_value * 64 + add) >> shift);

    /*Replicate the DC value within 16 bits in 128 bit register*/
    m_temp_reg_20 = _mm_set1_epi16(dc_value);
    zero_8x16b = _mm_setzero_si128();

    if(trans_size == 4)
    {
        WORD32 *pi4_dst = (WORD32 *)pu1_dst;

        m_temp_reg_0 = _mm_loadl_epi64((__m128i *)(pu1_pred));
        m_temp_reg_1 = _mm_loadl_epi64((__m128i *)(pu1_pred + pred_strd));
        m_temp_reg_2 = _mm_loadl_epi64((__m128i *)(pu1_pred + 2 * pred_strd));
        m_temp_reg_3 = _mm_loadl_epi64((__m128i *)(pu1_pred + 3 * pred_strd));

        m_temp_reg_4 = _mm_unpacklo_epi32(m_temp_reg_0, m_temp_reg_1);
        m_temp_reg_5 = _mm_unpacklo_epi32(m_temp_reg_2, m_temp_reg_3);

        m_temp_reg_4 = _mm_unpacklo_epi8(m_temp_reg_4, zero_8x16b);
        m_temp_reg_5 = _mm_unpacklo_epi8(m_temp_reg_5, zero_8x16b);

        m_temp_reg_6 = _mm_add_epi16(m_temp_reg_4, m_temp_reg_20);
        m_temp_reg_7 = _mm_add_epi16(m_temp_reg_5, m_temp_reg_20);

        m_temp_reg_8 = _mm_packus_epi16(m_temp_reg_6, m_temp_reg_7);


        *pi4_dst = _mm_cvtsi128_si32(m_temp_reg_8);
        m_temp_reg_1 = _mm_srli_si128(m_temp_reg_8, 4);
        m_temp_reg_2 = _mm_srli_si128(m_temp_reg_8, 8);
        m_temp_reg_3 = _mm_srli_si128(m_temp_reg_8, 12);
        pu1_dst += dst_strd;
        pi4_dst = (WORD32 *)(pu1_dst);

        *pi4_dst = _mm_cvtsi128_si32(m_temp_reg_1);
        pu1_dst += dst_strd;
        pi4_dst = (WORD32 *)(pu1_dst);

        *pi4_dst = _mm_cvtsi128_si32(m_temp_reg_2);
        pu1_dst += dst_strd;
        pi4_dst = (WORD32 *)(pu1_dst);

        *pi4_dst = _mm_cvtsi128_si32(m_temp_reg_3);
    }
    else
    {
        WORD32 i, j;

        for(i = 1; i <= trans_size; i += 4)
        {
            for(j = 1; j <= trans_size; j += 8)
            {

                m_temp_reg_0 = _mm_loadl_epi64((__m128i *)pu1_pred);
                m_temp_reg_1 = _mm_loadl_epi64((__m128i *)(pu1_pred + pred_strd));
                m_temp_reg_2 = _mm_loadl_epi64((__m128i *)(pu1_pred + 2 * pred_strd));
                m_temp_reg_3 = _mm_loadl_epi64((__m128i *)(pu1_pred + 3 * pred_strd));


                m_temp_reg_4 = _mm_unpacklo_epi8(m_temp_reg_0, zero_8x16b);
                m_temp_reg_5 = _mm_unpacklo_epi8(m_temp_reg_1, zero_8x16b);
                m_temp_reg_6 = _mm_unpacklo_epi8(m_temp_reg_2, zero_8x16b);
                m_temp_reg_7 = _mm_unpacklo_epi8(m_temp_reg_3, zero_8x16b);

                m_temp_reg_8 = _mm_add_epi16(m_temp_reg_4, m_temp_reg_20);
                m_temp_reg_9 = _mm_add_epi16(m_temp_reg_5, m_temp_reg_20);
                m_temp_reg_10 = _mm_add_epi16(m_temp_reg_6, m_temp_reg_20);
                m_temp_reg_11 = _mm_add_epi16(m_temp_reg_7, m_temp_reg_20);

                pi4_dst = (__m128i *)(pu1_dst);

                m_temp_reg_12 = _mm_packus_epi16(m_temp_reg_8, m_temp_reg_9);
                _mm_storel_epi64(pi4_dst, m_temp_reg_12);

                pi4_dst = (__m128i *)(pu1_dst + dst_strd);

                m_temp_reg_13 = _mm_srli_si128(m_temp_reg_12, 8);
                _mm_storel_epi64(pi4_dst, m_temp_reg_13);

                pi4_dst = (__m128i *)(pu1_dst + 2 * dst_strd);

                m_temp_reg_14 = _mm_packus_epi16(m_temp_reg_10, m_temp_reg_11);
                _mm_storel_epi64(pi4_dst, m_temp_reg_14);

                pi4_dst = (__m128i *)(pu1_dst + 3 * dst_strd);

                m_temp_reg_15 = _mm_srli_si128(m_temp_reg_14, 8);
                _mm_storel_epi64(pi4_dst, m_temp_reg_15);

                pu1_pred += 8;
                pu1_dst += 8;
            }
            pu1_pred += 4 * pred_strd - trans_size;
            pu1_dst += 4 * dst_strd - trans_size;
        }
    }


}